

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseWhileStatement(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  int last_line;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  int first_line;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_000000f0;
  ParserImpl *in_stack_000000f8;
  undefined1 in_stack_00000110 [32];
  ParserImpl *in_stack_ffffffffffffff10;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff28;
  WhileStatement *this_00;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  ParserImpl *in_stack_ffffffffffffff88;
  SyntaxTree in_stack_ffffffffffffff90;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_48;
  ParserImpl *pPStack_40;
  undefined8 local_38;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_30;
  undefined4 local_14;
  
  NextToken(in_stack_ffffffffffffff10);
  if (*(int *)(in_RSI + 0x20) != 0x114) {
    __assert_fail("current_.token_ == Token_While",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x128,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseWhileStatement()"
                 );
  }
  local_14 = *(undefined4 *)(in_RSI + 0x18);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff10);
  luna::TokenDetail::TokenDetail((TokenDetail *)&local_48);
  ParseExp(in_stack_000000f8,in_stack_000000f0,(TokenDetail)in_stack_00000110,this._4_4_);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  pTVar1 = NextToken(pPStack_40);
  if (pTVar1->token_ != 0x102) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              ((ParseException *)in_stack_ffffffffffffff90._vptr_SyntaxTree,
               (char *)in_stack_ffffffffffffff88,
               (TokenDetail *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  ParseBlock(in_stack_ffffffffffffff88);
  pTVar1 = NextToken(pPStack_40);
  if (pTVar1->token_ != 0x105) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              ((ParseException *)in_stack_ffffffffffffff90._vptr_SyntaxTree,
               (char *)in_stack_ffffffffffffff88,
               (TokenDetail *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  operator_new(0x20);
  this_00 = (WhileStatement *)&stack0xffffffffffffff90;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_40,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_48.str_);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_40,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_48.str_);
  luna::WhileStatement::WhileStatement
            (this_00,in_stack_ffffffffffffff28,puStack_30,(int)((ulong)local_38 >> 0x20),
             (int)local_38);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_40,
             (pointer)local_48.str_);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseWhileStatement()
        {
            NextToken();                // skip 'while'
            assert(current_.token_ == Token_While);

            int first_line = current_.line_;

            std::unique_ptr<SyntaxTree> exp = ParseExp();

            if (NextToken().token_ != Token_Do)
                throw ParseException("expect 'do' for while-statement", current_);

            std::unique_ptr<SyntaxTree> block = ParseBlock();

            if (NextToken().token_ != Token_End)
                throw ParseException("expect 'end' for while-statement", current_);

            int last_line = current_.line_;

            return std::unique_ptr<SyntaxTree>(new WhileStatement(std::move(exp), std::move(block),
                                                                  first_line, last_line));
        }